

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::PatchVertexCountCase::iterate(PatchVertexCountCase *this)

{
  int *value;
  string *this_00;
  TestLog *log;
  RenderContext *rCtx;
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  long lVar4;
  MessageBuilder *pMVar5;
  char *description;
  int i;
  float fVar6;
  Surface rendered;
  vector<float,_std::allocator<float>_> attributeData;
  undefined1 local_1f0 [40];
  RandomViewport viewport;
  VertexArrayBinding attrBindings [1];
  undefined4 extraout_var_00;
  
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  rCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar2 = (*rCtx->_vptr_RenderContext[4])(rCtx);
  dVar3 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var,iVar2),0x100,0x100,dVar3);
  dVar3 = (((this->m_program).m_ptr)->m_program).m_program;
  iVar2 = (*rCtx->_vptr_RenderContext[3])(rCtx);
  lVar4 = CONCAT44(extraout_var_00,iVar2);
  (**(code **)(lVar4 + 0x1a00))(viewport.x,viewport.y,viewport.width,viewport.height);
  (**(code **)(lVar4 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar4 + 0x1680))(dVar3);
  this_00 = &attrBindings[0].binding.name;
  attrBindings[0].binding._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"Note: input patch size is ");
  value = &this->m_inputPatchSize;
  pMVar5 = tcu::MessageBuilder::operator<<((MessageBuilder *)attrBindings,value);
  std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                  ", output patch size is ");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&this->m_outputPatchSize);
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  attributeData.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  attributeData.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  attributeData.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<float,_std::allocator<float>_>::reserve(&attributeData,(long)*value);
  iVar2 = 0;
  while( true ) {
    if (*value <= iVar2) break;
    fVar6 = (float)iVar2 / (float)(*value + -1);
    attrBindings[0].binding.type = (Type)(fVar6 * fVar6);
    std::vector<float,_std::allocator<float>_>::emplace_back<float>
              (&attributeData,(float *)attrBindings);
    iVar2 = iVar2 + 1;
  }
  (**(code **)(lVar4 + 0xfd8))(0x8e72);
  (**(code **)(lVar4 + 0x188))(0x4000);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1f0,"in_v_attr",(allocator<char> *)&rendered);
  glu::va::Float(attrBindings,(string *)local_1f0,1,
                 (int)((ulong)((long)attributeData.super__Vector_base<float,_std::allocator<float>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)attributeData.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2),0,
                 attributeData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start);
  std::__cxx11::string::~string((string *)local_1f0);
  local_1f0._4_4_ = this->m_inputPatchSize;
  local_1f0._0_4_ = PRIMITIVETYPE_PATCHES;
  local_1f0._8_4_ = INDEXTYPE_LAST;
  local_1f0._16_8_ = 0;
  glu::draw(((this->super_TestCase).m_context)->m_renderCtx,dVar3,1,attrBindings,
            (PrimitiveList *)local_1f0,(DrawUtilCallback *)0x0);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Draw failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                  ,0xbdc);
  std::__cxx11::string::~string((string *)&attrBindings[0].binding.name);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&attributeData.super__Vector_base<float,_std::allocator<float>_>);
  getPixels(&rendered,rCtx,&viewport);
  getPNG((TextureLevel *)attrBindings,
         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_curArchive,
         &this->m_referenceImagePath);
  tcu::TextureLevel::getAccess((ConstPixelBufferAccess *)local_1f0,(TextureLevel *)attrBindings);
  tcu::Surface::getAccess((ConstPixelBufferAccess *)&attributeData,&rendered);
  bVar1 = tcu::fuzzyCompare(log,"ImageComparison","Image Comparison",
                            (ConstPixelBufferAccess *)local_1f0,
                            (ConstPixelBufferAccess *)&attributeData,0.02,COMPARE_LOG_RESULT);
  description = "Image comparison failed";
  if (bVar1) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar1,description
            );
  tcu::TextureLevel::~TextureLevel((TextureLevel *)attrBindings);
  tcu::Surface::~Surface(&rendered);
  return STOP;
}

Assistant:

PatchVertexCountCase::IterateResult PatchVertexCountCase::iterate (void)
{
	TestLog&					log						= m_testCtx.getLog();
	const RenderContext&		renderCtx				= m_context.getRenderContext();
	const RandomViewport		viewport				(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const deUint32				programGL				= m_program->getProgram();
	const glw::Functions&		gl						= renderCtx.getFunctions();

	setViewport(gl, viewport);
	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.useProgram(programGL);

	log << TestLog::Message << "Note: input patch size is " << m_inputPatchSize << ", output patch size is " << m_outputPatchSize << TestLog::EndMessage;

	{
		vector<float> attributeData;
		attributeData.reserve(m_inputPatchSize);

		for (int i = 0; i < m_inputPatchSize; i++)
		{
			const float f = (float)i / (float)(m_inputPatchSize-1);
			attributeData.push_back(f*f);
		}

		gl.patchParameteri(GL_PATCH_VERTICES, m_inputPatchSize);
		gl.clear(GL_COLOR_BUFFER_BIT);

		const glu::VertexArrayBinding attrBindings[] =
		{
			glu::va::Float("in_v_attr", 1, (int)attributeData.size(), 0, &attributeData[0])
		};

		glu::draw(m_context.getRenderContext(), programGL, DE_LENGTH_OF_ARRAY(attrBindings), &attrBindings[0],
			glu::pr::Patches(m_inputPatchSize));
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw failed");
	}

	{
		const tcu::Surface			rendered	= getPixels(renderCtx, viewport);
		const tcu::TextureLevel		reference	= getPNG(m_testCtx.getArchive(), m_referenceImagePath);
		const bool					success		= tcu::fuzzyCompare(log, "ImageComparison", "Image Comparison", reference.getAccess(), rendered.getAccess(), 0.02f, tcu::COMPARE_LOG_RESULT);

		m_testCtx.setTestResult(success ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, success ? "Pass" : "Image comparison failed");
		return STOP;
	}
}